

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O3

void qtree_onebit64(LONGLONG *a,int n,int nx,int ny,uchar *b,int bit)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  bVar1 = (byte)bit;
  uVar13 = 2L << (bVar1 & 0x3f);
  uVar12 = 4L << (bVar1 & 0x3f);
  uVar11 = 8L << (bVar1 & 0x3f);
  iVar10 = 0;
  iVar9 = 0;
  if (1 < nx) {
    iVar5 = 0;
    iVar9 = 0;
    iVar10 = 0;
    iVar6 = n;
    do {
      if (ny < 2) {
        iVar7 = iVar9 * n;
        iVar2 = n + iVar7;
        uVar4 = 0;
      }
      else {
        puVar3 = b + iVar10;
        lVar8 = 0;
        do {
          *puVar3 = (uchar)((long)(a[iVar5 + lVar8] << 3 & uVar11 |
                                   a[(long)iVar5 + lVar8 + 1] << 2 & uVar12 |
                                  a[iVar6 + lVar8] * 2 & uVar13 |
                                  a[(long)iVar6 + lVar8 + 1] & 1L << (bVar1 & 0x3f)) >>
                           (bVar1 & 0x3f));
          puVar3 = puVar3 + 1;
          iVar10 = iVar10 + 1;
          lVar8 = lVar8 + 2;
          iVar7 = (int)lVar8;
        } while (iVar7 < ny + -1);
        iVar2 = iVar6 + iVar7;
        iVar7 = iVar7 + iVar5;
        uVar4 = ny & 0xfffffffe;
      }
      if ((int)uVar4 < ny) {
        b[iVar10] = (uchar)((long)(a[iVar7] << 3 & uVar11 | a[iVar2] * 2 & uVar13) >> (bVar1 & 0x3f)
                           );
        iVar10 = iVar10 + 1;
      }
      iVar9 = iVar9 + 2;
      iVar5 = iVar5 + n * 2;
      iVar6 = iVar6 + n * 2;
    } while (iVar9 < nx + -1);
  }
  if (iVar9 < nx) {
    iVar9 = iVar9 * n;
    uVar4 = 0;
    if (1 < ny) {
      uVar4 = ny & 0x7ffffffe;
      puVar3 = b + iVar10;
      lVar8 = 0;
      do {
        *puVar3 = (uchar)((long)(a[iVar9 + lVar8] << 3 & uVar11 |
                                a[(long)iVar9 + lVar8 + 1] << 2 & uVar12) >> (bVar1 & 0x3f));
        puVar3 = puVar3 + 1;
        iVar10 = iVar10 + 1;
        lVar8 = lVar8 + 2;
      } while ((int)lVar8 < ny + -1);
      iVar9 = iVar9 + (int)lVar8;
    }
    if ((int)uVar4 < ny) {
      b[iVar10] = (uchar)((long)(a[iVar9] << 3 & uVar11) >> (bVar1 & 0x3f));
    }
  }
  return;
}

Assistant:

static void
qtree_onebit64(LONGLONG a[], int n, int nx, int ny, unsigned char b[], int bit)
{
int i, j, k;
LONGLONG b0, b1, b2, b3;
int s10, s00;

	/*
	 * use selected bit to get amount to shift
	 */
	b0 = ((LONGLONG) 1)<<bit;
	b1 = b0<<1;
	b2 = b0<<2;
	b3 = b0<<3;
	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {
			b[k] = (unsigned char) (( ( a[s10+1]     & b0)
				   | ((a[s10  ]<<1) & b1)
				   | ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] = (unsigned char) (( ((a[s10  ]<<1) & b1)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] = (unsigned char) (( ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = (unsigned char) (( ((a[s00  ]<<3) & b3) ) >> bit);
			k += 1;
		}
	}
}